

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O1

size_t __thiscall
iDynTree::SubModelDecomposition::getSubModelOfFrame
          (SubModelDecomposition *this,Model *model,FrameIndex *frame)

{
  ostream *poVar1;
  size_t sVar2;
  LinkIndex linkOfFrame;
  LinkIndex local_18;
  
  local_18 = Model::getFrameLink(model,*frame);
  if (local_18 == LINK_INVALID_INDEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"SubModelDecomposition error: requested frame index ",0x33);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"outside bounds ",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    sVar2 = 0;
  }
  else {
    sVar2 = getSubModelOfLink(this,&local_18);
  }
  return sVar2;
}

Assistant:

size_t SubModelDecomposition::getSubModelOfFrame(const Model & model, const FrameIndex& frame) const
{
    size_t ret = 0;
    LinkIndex linkOfFrame = model.getFrameLink(frame);

    if( linkOfFrame != LINK_INVALID_INDEX )
    {
        ret = this->getSubModelOfLink(linkOfFrame);
    }
    else
    {
        std::cerr << "SubModelDecomposition error: requested frame index " << frame
                  << "outside bounds " << std::endl;
    }

    return ret;
}